

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhitm.c
# Opt level: O2

void stumble_onto_mimic(monst *mtmp,schar dx,schar dy)

{
  uint uVar1;
  boolean bVar2;
  char *pcVar3;
  char *line;
  
  if ((u.ustuck == (monst *)0x0) && ((mtmp->field_0x62 & 1) == 0)) {
    bVar2 = dmgtype(mtmp->data,0x13);
    if (bVar2 != '\0') {
      u.ustuck = mtmp;
    }
  }
  if (u.uprops[0x1e].intrinsic == 0) {
    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0025de21;
    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0025de1c;
LAB_0025dede:
    uVar1 = *(uint *)(level->locations[(long)dx + (long)u.ux] + (long)dy + (long)u.uy);
    pcVar3 = "Wait!  That\'s %s!";
    if ((uVar1 & 0x1ff800) == 0xf8000) {
      pcVar3 = "That gold was %s!";
    }
    line = "The door actually was %s!";
    if (1 < (uVar1 & 0x3f) - 0x1b) {
      line = pcVar3;
    }
    if (((((mtmp->field_0x60 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
        (u.uprops[0xc].extrinsic != 0)) || (((youmonst.data)->mflags1 & 0x1000000) != 0))
    goto LAB_0025df74;
    pcVar3 = "a monster";
  }
  else {
LAB_0025de1c:
    if (ublindf != (obj *)0x0) {
LAB_0025de21:
      if (ublindf->oartifact == '\x1d') goto LAB_0025dede;
    }
    line = "Wait!  That\'s %s!";
    pcVar3 = "a monster";
    if ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
         (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
         youmonst.data == mons + 0x32) && (u.uprops[0x19].blocked == 0)) {
      if (mtmp->m_ap_type != '\x03') goto LAB_0025df8e;
      line = "Wait!  That\'s %s!";
LAB_0025df74:
      pcVar3 = a_monnam(mtmp);
      if (pcVar3 == (char *)0x0) goto LAB_0025df8e;
    }
  }
  pline(line,pcVar3);
LAB_0025df8e:
  wakeup(mtmp);
  return;
}

Assistant:

void stumble_onto_mimic(struct monst *mtmp, schar dx, schar dy)
{
	const char *fmt = "Wait!  That's %s!",
		   *generic = "a monster",
		   *what = 0;

	if (!u.ustuck && !mtmp->mflee && dmgtype(mtmp->data,AD_STCK))
	    u.ustuck = mtmp;

	if (Blind) {
	    if (!Blind_telepat)
		what = generic;		/* with default fmt */
	    else if (mtmp->m_ap_type == M_AP_MONSTER)
		what = a_monnam(mtmp);	/* differs from what was sensed */
	} else {
	    if (level->locations[u.ux+dx][u.uy+dy].mem_bg == S_hcdoor ||
		level->locations[u.ux+dx][u.uy+dy].mem_bg == S_vcdoor)
		fmt = "The door actually was %s!";
	    else if (level->locations[u.ux+dx][u.uy+dy].mem_obj - 1 == GOLD_PIECE)
		fmt = "That gold was %s!";

	    /* cloned Wiz starts out mimicking some other monster and
	       might make himself invisible before being revealed */
	    if (mtmp->minvis && !See_invisible)
		what = generic;
	    else
		what = a_monnam(mtmp);
	}
	if (what) pline(fmt, what);

	wakeup(mtmp);	/* clears mimicking */
}